

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_expression.hpp
# Opt level: O0

ColumnRefExpression * __thiscall
duckdb::BaseExpression::Cast<duckdb::ColumnRefExpression>(BaseExpression *this)

{
  string *msg;
  ColumnRefExpression *in_RDI;
  allocator *this_00;
  allocator aStack_29;
  string asStack_28 [40];
  
  if ((in_RDI->super_ParsedExpression).super_BaseExpression.expression_class != COLUMN_REF) {
    msg = (string *)__cxa_allocate_exception(0x10);
    this_00 = &aStack_29;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (asStack_28,"Failed to cast expression to type - expression type mismatch",this_00);
    InternalException::InternalException((InternalException *)this_00,msg);
    __cxa_throw(msg,&InternalException::typeinfo,InternalException::~InternalException);
  }
  return in_RDI;
}

Assistant:

TARGET &Cast() {
		if (expression_class != TARGET::TYPE) {
			throw InternalException("Failed to cast expression to type - expression type mismatch");
		}
		return reinterpret_cast<TARGET &>(*this);
	}